

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

int xmlSetError(xmlError *err,void *ctxt,xmlNodePtr node,int domain,int code,xmlErrorLevel level,
               char *file,int line,char *str1,char *str2,char *str3,int int1,int col,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [48];
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined1 local_78 [4];
  int res;
  va_list ap;
  xmlErrorLevel level_local;
  int code_local;
  int domain_local;
  xmlNodePtr node_local;
  void *ctxt_local;
  xmlError *err_local;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_138;
  ap[0]._0_8_ = &stack0x00000048;
  res = 0x30;
  local_78 = (undefined1  [4])0x30;
  iVar1 = xmlVSetError(err,ctxt,node,domain,code,level,file,line,str1,str2,str3,int1,col,fmt,
                       (__va_list_tag *)local_78);
  return iVar1;
}

Assistant:

static int LIBXML_ATTR_FORMAT(14,15)
xmlSetError(xmlError *err,
            void *ctxt, xmlNodePtr node,
            int domain, int code, xmlErrorLevel level,
            const char *file, int line,
            const char *str1, const char *str2, const char *str3,
            int int1, int col,
            const char *fmt, ...)
{
    va_list ap;
    int res;

    va_start(ap, fmt);
    res = xmlVSetError(err, ctxt, node, domain, code, level, file, line,
                       str1, str2, str3, int1, col, fmt, ap);
    va_end(ap);

    return(res);
}